

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O1

void mbedtls_mpi_free(mbedtls_mpi *X)

{
  mbedtls_mpi_uint *__ptr;
  size_t sVar1;
  size_t sVar2;
  
  if (X != (mbedtls_mpi *)0x0) {
    __ptr = X->p;
    if (__ptr != (mbedtls_mpi_uint *)0x0) {
      sVar1 = X->n;
      if (sVar1 != 0) {
        sVar2 = 0;
        do {
          __ptr[sVar2] = 0;
          sVar2 = sVar2 + 1;
        } while (sVar1 != sVar2);
      }
      free(__ptr);
    }
    X->s = 1;
    X->n = 0;
    X->p = (mbedtls_mpi_uint *)0x0;
  }
  return;
}

Assistant:

void mbedtls_mpi_free( mbedtls_mpi *X )
{
    if( X == NULL )
        return;

    if( X->p != NULL )
    {
        mbedtls_mpi_zeroize( X->p, X->n );
        mbedtls_free( X->p );
    }

    X->s = 1;
    X->n = 0;
    X->p = NULL;
}